

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Globals.h
# Opt level: O0

void Snapshot(void)

{
  return;
}

Assistant:

inline void Snapshot(void)
{
#ifndef DISABLE_OPENCV_SUPPORT
	int i = 0;
	double d0 = 0, d1 = 0, d2 = 0;
	char strtime_snap[MAX_BUF_LEN];
	char snapfilename[MAX_BUF_LEN];
	char picsnapfilename[MAX_BUF_LEN];
	char kmlsnapfilename[MAX_BUF_LEN];
	FILE* kmlsnapfile = NULL;

	memset(strtime_snap, 0, sizeof(strtime_snap));
	EnterCriticalSection(&strtimeCS);
	strcpy(strtime_snap, strtimeex_fns());
	LeaveCriticalSection(&strtimeCS);
	for (i = 0; i < MAX_NB_VIDEO; i++)
	{
		if (!bDisableVideo[i])
		{
			sprintf(snapfilename, "snap%d_%.64s.png", i, strtime_snap);
			sprintf(picsnapfilename, PIC_FOLDER"snap%d_%.64s.png", i, strtime_snap);
			EnterCriticalSection(&imgsCS[i]);
#ifndef USE_OPENCV_HIGHGUI_CPP_API
			if (!cvSaveImage(picsnapfilename, imgs[i], 0))
#else
			if (!cv::imwrite(picsnapfilename, cv::cvarrToMat(imgs[i])))
#endif // !USE_OPENCV_HIGHGUI_CPP_API
			{
				printf("Error saving a snapshot file.\n");
			}
			LeaveCriticalSection(&imgsCS[i]);
			EnvCoordSystem2GPS(lat_env, long_env, alt_env, angle_env, Center(xhat), Center(yhat), Center(zhat), &d0, &d1, &d2);
			sprintf(kmlsnapfilename, PIC_FOLDER"snap%d_%.64s.kml", i, strtime_snap);
			kmlsnapfile = fopen(kmlsnapfilename, "w");
			if (kmlsnapfile == NULL)
			{
				printf("Error saving a snapshot file.\n");
				continue;
			}
			fprintf(kmlsnapfile, "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n");
			fprintf(kmlsnapfile, "<kml xmlns=\"http://www.opengis.net/kml/2.2\" xmlns:gx=\"http://www.google.com/kml/ext/2.2\" xmlns:kml=\"http://www.opengis.net/kml/2.2\" xmlns:atom=\"http://www.w3.org/2005/Atom\">\n");
			fprintf(kmlsnapfile, "<Document>\n<name>snap%d_%.64s</name>\n", i, strtime_snap);
			fprintf(kmlsnapfile, "\t<PhotoOverlay>\n\t\t<name>snap%d_%.64s</name>\n", i, strtime_snap);
			fprintf(kmlsnapfile, "\t\t<Camera>\n\t\t\t<longitude>%.8f</longitude>\n\t\t\t<latitude>%.8f</latitude>\n\t\t\t<altitude>%.3f</altitude>\n", d1, d0, d2);
			fprintf(kmlsnapfile, "\t\t\t<heading>%f</heading>\n\t\t\t<tilt>%f</tilt>\n\t\t\t<roll>%f</roll>\n", (fmod_2PI(-angle_env-Center(psihat)+3.0*M_PI/2.0)+M_PI)*180.0/M_PI, 0.0, 0.0);
			fprintf(kmlsnapfile, "\t\t\t<altitudeMode>relativeToGround</altitudeMode>\n\t\t\t<gx:altitudeMode>relativeToSeaFloor</gx:altitudeMode>\n\t\t</Camera>\n");
			fprintf(kmlsnapfile, "\t\t<Style>\n\t\t\t<IconStyle>\n\t\t\t\t<Icon>\n\t\t\t\t\t<href>:/camera_mode.png</href>\n\t\t\t\t</Icon>\n\t\t\t</IconStyle>\n");
			fprintf(kmlsnapfile, "\t\t\t<ListStyle>\n\t\t\t\t<listItemType>check</listItemType>\n\t\t\t\t<ItemIcon>\n\t\t\t\t\t<state>open closed error fetching0 fetching1 fetching2</state>\n");
			fprintf(kmlsnapfile, "\t\t\t\t\t<href>http://maps.google.com/mapfiles/kml/shapes/camera-lv.png</href>\n\t\t\t\t</ItemIcon>\n\t\t\t\t<bgColor>00ffffff</bgColor>\n\t\t\t\t<maxSnippetLines>2</maxSnippetLines>\n");
			fprintf(kmlsnapfile, "\t\t\t</ListStyle>\n\t\t</Style>\n");
			fprintf(kmlsnapfile, "\t\t<Icon>\n\t\t\t<href>%.255s</href>\n\t\t</Icon>\n", snapfilename);
			fprintf(kmlsnapfile, "\t\t<ViewVolume>\n\t\t\t<leftFov>-25</leftFov>\n\t\t\t<rightFov>25</rightFov>\n\t\t\t<bottomFov>-16.25</bottomFov>\n\t\t\t<topFov>16.25</topFov>\n\t\t\t<near>7.92675</near>\n\t\t</ViewVolume>\n");
			fprintf(kmlsnapfile, "\t\t<Point>\n\t\t\t<altitudeMode>relativeToGround</altitudeMode>\n\t\t\t<gx:altitudeMode>relativeToSeaFloor</gx:altitudeMode>\n\t\t\t<coordinates>%.8f,%.8f,%.3f</coordinates>\n\t\t</Point>\n", d1, d0, d2);
			fprintf(kmlsnapfile, "\t</PhotoOverlay>\n");
			fprintf(kmlsnapfile, "</Document>\n</kml>\n");
			fclose(kmlsnapfile);
		}
	}
	for (i = 0; i < nbopencvgui; i++)
	{
		if (bEnableOpenCVGUIs[i])
		{
			sprintf(snapfilename, "snapgui%d_%.64s.png", i, strtime_snap);
			sprintf(picsnapfilename, PIC_FOLDER"snapgui%d_%.64s.png", i, strtime_snap);
			EnterCriticalSection(&dispimgsCS[i]);
#ifndef USE_OPENCV_HIGHGUI_CPP_API
			if (!cvSaveImage(picsnapfilename, dispimgs[i], 0))
#else
			if (!cv::imwrite(picsnapfilename, cv::cvarrToMat(dispimgs[i])))
#endif // !USE_OPENCV_HIGHGUI_CPP_API
			{
				printf("Error saving a snapshot file.\n");
			}
			LeaveCriticalSection(&dispimgsCS[i]);
			EnvCoordSystem2GPS(lat_env, long_env, alt_env, angle_env, Center(xhat), Center(yhat), Center(zhat), &d0, &d1, &d2);
			sprintf(kmlsnapfilename, PIC_FOLDER"snapgui%d_%.64s.kml", i, strtime_snap);
			kmlsnapfile = fopen(kmlsnapfilename, "w");
			if (kmlsnapfile == NULL)
			{
				printf("Error saving a snapshot file.\n");
				continue;
			}
			fprintf(kmlsnapfile, "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n");
			fprintf(kmlsnapfile, "<kml xmlns=\"http://www.opengis.net/kml/2.2\" xmlns:gx=\"http://www.google.com/kml/ext/2.2\" xmlns:kml=\"http://www.opengis.net/kml/2.2\" xmlns:atom=\"http://www.w3.org/2005/Atom\">\n");
			fprintf(kmlsnapfile, "<Document>\n<name>snapgui%d_%.64s</name>\n", i, strtime_snap);
			fprintf(kmlsnapfile, "\t<PhotoOverlay>\n\t\t<name>snapgui%d_%.64s</name>\n", i, strtime_snap);
			fprintf(kmlsnapfile, "\t\t<Camera>\n\t\t\t<longitude>%.8f</longitude>\n\t\t\t<latitude>%.8f</latitude>\n\t\t\t<altitude>%.3f</altitude>\n", d1, d0, d2);
			fprintf(kmlsnapfile, "\t\t\t<heading>%f</heading>\n\t\t\t<tilt>%f</tilt>\n\t\t\t<roll>%f</roll>\n", (fmod_2PI(-angle_env-Center(psihat)+3.0*M_PI/2.0)+M_PI)*180.0/M_PI, 0.0, 0.0);
			fprintf(kmlsnapfile, "\t\t\t<altitudeMode>relativeToGround</altitudeMode>\n\t\t\t<gx:altitudeMode>relativeToSeaFloor</gx:altitudeMode>\n\t\t</Camera>\n");
			fprintf(kmlsnapfile, "\t\t<Style>\n\t\t\t<IconStyle>\n\t\t\t\t<Icon>\n\t\t\t\t\t<href>:/camera_mode.png</href>\n\t\t\t\t</Icon>\n\t\t\t</IconStyle>\n");
			fprintf(kmlsnapfile, "\t\t\t<ListStyle>\n\t\t\t\t<listItemType>check</listItemType>\n\t\t\t\t<ItemIcon>\n\t\t\t\t\t<state>open closed error fetching0 fetching1 fetching2</state>\n");
			fprintf(kmlsnapfile, "\t\t\t\t\t<href>http://maps.google.com/mapfiles/kml/shapes/camera-lv.png</href>\n\t\t\t\t</ItemIcon>\n\t\t\t\t<bgColor>00ffffff</bgColor>\n\t\t\t\t<maxSnippetLines>2</maxSnippetLines>\n");
			fprintf(kmlsnapfile, "\t\t\t</ListStyle>\n\t\t</Style>\n");
			fprintf(kmlsnapfile, "\t\t<Icon>\n\t\t\t<href>%.255s</href>\n\t\t</Icon>\n", snapfilename);
			fprintf(kmlsnapfile, "\t\t<ViewVolume>\n\t\t\t<leftFov>-25</leftFov>\n\t\t\t<rightFov>25</rightFov>\n\t\t\t<bottomFov>-16.25</bottomFov>\n\t\t\t<topFov>16.25</topFov>\n\t\t\t<near>7.92675</near>\n\t\t</ViewVolume>\n");
			fprintf(kmlsnapfile, "\t\t<Point>\n\t\t\t<altitudeMode>relativeToGround</altitudeMode>\n\t\t\t<gx:altitudeMode>relativeToSeaFloor</gx:altitudeMode>\n\t\t\t<coordinates>%.8f,%.8f,%.3f</coordinates>\n\t\t</Point>\n", d1, d0, d2);
			fprintf(kmlsnapfile, "\t</PhotoOverlay>\n");
			fprintf(kmlsnapfile, "</Document>\n</kml>\n");
			fclose(kmlsnapfile);
			}
		}
#endif // !DISABLE_OPENCV_SUPPORT
}